

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::add_sample
          (TypedTimeSamples<tinyusdz::value::matrix4d> *this,double t,matrix4d *v)

{
  Sample *pSVar1;
  long lVar2;
  matrix4d *pmVar3;
  Sample local_98;
  
  pSVar1 = &local_98;
  local_98.blocked = false;
  for (lVar2 = 0x10; pmVar3 = &pSVar1->value, lVar2 != 0; lVar2 = lVar2 + -1) {
    pSVar1 = (Sample *)pmVar3->m;
    pmVar3->m[0][0] = *(double *)v;
    v = (matrix4d *)((long)v + 8);
  }
  local_98.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
              *)this,&local_98);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }